

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O3

StatusOr<google::protobuf::FeatureSet> *
google::protobuf::anon_unknown_0::GetDefaults
          (StatusOr<google::protobuf::FeatureSet> *__return_storage_ptr__,Edition edition,
          FeatureSetDefaults *defaults)

{
  StatusOr<google::protobuf::FeatureSet> *extraout_RAX;
  FeatureSet parent;
  StatusOr<google::protobuf::FeatureResolver> resolver;
  FeatureSet child;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1 local_108 [10];
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1 local_b8;
  FeatureResolver local_b0;
  FeatureSet local_60;
  
  FeatureResolver::Create
            ((StatusOr<google::protobuf::FeatureResolver> *)&local_b8.status_,edition,defaults);
  local_108[0] = local_b8;
  if (((ulong)local_b8 & 1) == 0) {
    LOCK();
    *(int *)local_b8 = *(int *)local_b8 + 1;
    UNLOCK();
  }
  if (local_b8 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1)0x1
     ) {
    FeatureSet::FeatureSet((FeatureSet *)&local_108[0].status_,(Arena *)0x0);
    FeatureSet::FeatureSet(&local_60,(Arena *)0x0);
    if (local_b8 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1)0x1) {
      absl::lts_20250127::internal_statusor::Helper::Crash(&local_b8.status_);
    }
    FeatureResolver::MergeFeatures
              (__return_storage_ptr__,&local_b0,(FeatureSet *)&local_108[0].status_,&local_60);
    FeatureSet::~FeatureSet(&local_60);
    FeatureSet::~FeatureSet((FeatureSet *)&local_108[0].status_);
  }
  else {
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
    StatusOrData<const_absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSet>,
               &local_108[0].status_);
    absl::lts_20250127::Status::~Status(&local_108[0].status_);
  }
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
  ~StatusOrData((StatusOrData<google::protobuf::FeatureResolver> *)&local_b8.status_);
  return extraout_RAX;
}

Assistant:

absl::StatusOr<FeatureSet> GetDefaults(Edition edition,
                                       const FeatureSetDefaults& defaults) {
  absl::StatusOr<FeatureResolver> resolver =
      FeatureResolver::Create(edition, defaults);
  RETURN_IF_ERROR(resolver.status());
  FeatureSet parent, child;
  return resolver->MergeFeatures(parent, child);
}